

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O2

void __thiscall netbase_tests::isbadport::test_method(isbadport *this)

{
  bool bVar1;
  size_t sVar2;
  uint16_t uVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  check_type cVar6;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  lazy_ostream local_90;
  undefined1 *local_80;
  char **local_78;
  size_t total_bad_ports;
  element_type *local_68;
  shared_count sStack_60;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  uint16_t port;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_40 = "";
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x256;
  file.m_begin = (iterator)&local_48;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_58,msg);
  bVar1 = IsBadPort(1);
  total_bad_ports = CONCAT71(total_bad_ports._1_7_,bVar1);
  local_68 = (element_type *)0x0;
  sStack_60.pi_ = (sp_counted_base *)0x0;
  local_a0 = "IsBadPort(1)";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_a8 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&total_bad_ports,&local_90,1,0,WARN,_cVar6,(size_t)&local_b0,0x256)
  ;
  boost::detail::shared_count::~shared_count(&sStack_60);
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  file_00.m_end = (iterator)0x257;
  file_00.m_begin = (iterator)&local_c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_d0,msg_00
            );
  bVar1 = IsBadPort(0x16);
  total_bad_ports = CONCAT71(total_bad_ports._1_7_,bVar1);
  local_68 = (element_type *)0x0;
  sStack_60.pi_ = (sp_counted_base *)0x0;
  local_a0 = "IsBadPort(22)";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_d8 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&total_bad_ports,&local_90,1,0,WARN,_cVar6,(size_t)&local_e0,599);
  boost::detail::shared_count::~shared_count(&sStack_60);
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  file_01.m_end = (iterator)0x258;
  file_01.m_begin = (iterator)&local_f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_100,
             msg_01);
  bVar1 = IsBadPort(6000);
  total_bad_ports = CONCAT71(total_bad_ports._1_7_,bVar1);
  local_68 = (element_type *)0x0;
  sStack_60.pi_ = (sp_counted_base *)0x0;
  local_a0 = "IsBadPort(6000)";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_108 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&total_bad_ports,&local_90,1,0,WARN,_cVar6,(size_t)&local_110,600);
  boost::detail::shared_count::~shared_count(&sStack_60);
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  file_02.m_end = (iterator)0x25a;
  file_02.m_begin = (iterator)&local_120;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_130,
             msg_02);
  bVar1 = IsBadPort(0x50);
  total_bad_ports = CONCAT71(total_bad_ports._1_7_,!bVar1);
  local_68 = (element_type *)0x0;
  sStack_60.pi_ = (sp_counted_base *)0x0;
  local_a0 = "!IsBadPort(80)";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_138 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&total_bad_ports,&local_90,1,0,WARN,_cVar6,(size_t)&local_140,0x25a
            );
  boost::detail::shared_count::~shared_count(&sStack_60);
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar4;
  file_03.m_end = (iterator)0x25b;
  file_03.m_begin = (iterator)&local_150;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_160,
             msg_03);
  bVar1 = IsBadPort(0x1bb);
  total_bad_ports = CONCAT71(total_bad_ports._1_7_,!bVar1);
  local_68 = (element_type *)0x0;
  sStack_60.pi_ = (sp_counted_base *)0x0;
  local_a0 = "!IsBadPort(443)";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_168 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&total_bad_ports,&local_90,1,0,WARN,_cVar6,(size_t)&local_170,0x25b
            );
  boost::detail::shared_count::~shared_count(&sStack_60);
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar4;
  file_04.m_end = (iterator)0x25c;
  file_04.m_begin = (iterator)&local_180;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_190,
             msg_04);
  bVar1 = IsBadPort(0x208d);
  total_bad_ports = CONCAT71(total_bad_ports._1_7_,!bVar1);
  local_68 = (element_type *)0x0;
  sStack_60.pi_ = (sp_counted_base *)0x0;
  local_a0 = "!IsBadPort(8333)";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_198 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&total_bad_ports,&local_90,1,0,WARN,_cVar6,(size_t)&local_1a0,0x25c
            );
  boost::detail::shared_count::~shared_count(&sStack_60);
  total_bad_ports = 0;
  sVar2 = 0;
  port = 0xffff;
  while (uVar3 = port - 1, port != 0) {
    bVar1 = IsBadPort(port);
    port = uVar3;
    if (bVar1) {
      sVar2 = sVar2 + 1;
      total_bad_ports = sVar2;
    }
  }
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar5;
  msg_05.m_begin = pvVar4;
  file_05.m_end = (iterator)0x265;
  file_05.m_begin = (iterator)&local_1b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1c0,
             msg_05);
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = (char **)0xc694e1;
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_1c8 = "";
  local_a0 = (char *)CONCAT44(local_a0._4_4_,0x50);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&local_90,&local_1d0,0x265,1,2,&total_bad_ports,"total_bad_ports",&local_a0,"80");
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(isbadport)
{
    BOOST_CHECK(IsBadPort(1));
    BOOST_CHECK(IsBadPort(22));
    BOOST_CHECK(IsBadPort(6000));

    BOOST_CHECK(!IsBadPort(80));
    BOOST_CHECK(!IsBadPort(443));
    BOOST_CHECK(!IsBadPort(8333));

    // Check all ports, there must be 80 bad ports in total.
    size_t total_bad_ports{0};
    for (uint16_t port = std::numeric_limits<uint16_t>::max(); port > 0; --port) {
        if (IsBadPort(port)) {
            ++total_bad_ports;
        }
    }
    BOOST_CHECK_EQUAL(total_bad_ports, 80);
}